

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  EpsCopyOutputStream *this_00;
  void *__src;
  uint uVar4;
  byte *in_RCX;
  int in_ESI;
  string *in_RDI;
  ptrdiff_t size;
  uint8 *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb4;
  uint32 num_00;
  byte *local_20;
  byte *local_18;
  uint local_c;
  byte *local_8;
  
  this_00 = (EpsCopyOutputStream *)std::__cxx11::string::size();
  num_00 = CONCAT13(1,(int3)in_stack_ffffffffffffffb4);
  if ((long)this_00 < 0x80) {
    in_stack_ffffffffffffffa0 = (uint8 *)((*(long *)in_RDI - (long)in_RCX) + 0x10);
    iVar3 = TagSize(in_ESI << 3);
    num_00 = CONCAT13((long)(in_stack_ffffffffffffffa0 + (-1 - (long)iVar3)) < (long)this_00,
                      (int3)num_00);
  }
  if ((char)(num_00 >> 0x18) == '\0') {
    uVar4 = in_ESI << 3 | 2;
    bVar2 = (byte)uVar4;
    if (uVar4 < 0x80) {
      *in_RCX = bVar2;
      local_8 = in_RCX + 1;
    }
    else {
      *in_RCX = bVar2 | 0x80;
      local_c = (uint)(in_ESI << 3) >> 7;
      if (local_c < 0x80) {
        in_RCX[1] = (byte)local_c;
        local_8 = in_RCX + 2;
      }
      else {
        pbVar1 = in_RCX + 1;
        do {
          local_18 = pbVar1;
          *local_18 = (byte)local_c | 0x80;
          local_c = local_c >> 7;
          pbVar1 = local_18 + 1;
        } while (0x7f < local_c);
        local_8 = local_18 + 2;
        local_18[1] = (byte)local_c;
      }
    }
    *local_8 = (byte)this_00;
    __src = (void *)std::__cxx11::string::data();
    memcpy(local_8 + 1,__src,(size_t)this_00);
    local_20 = local_8 + 1 + (long)this_00;
  }
  else {
    local_20 = WriteStringMaybeAliasedOutline(this_00,num_00,in_RDI,in_stack_ffffffffffffffa0);
  }
  return local_20;
}

Assistant:

uint8* WriteStringMaybeAliased(uint32 num, const std::string& s, uint8* ptr) {
    std::ptrdiff_t size = s.size();
    if (PROTOBUF_PREDICT_FALSE(
            size >= 128 || end_ - ptr + 16 - TagSize(num << 3) - 1 < size)) {
      return WriteStringMaybeAliasedOutline(num, s, ptr);
    }
    ptr = UnsafeVarint((num << 3) | 2, ptr);
    *ptr++ = static_cast<uint8>(size);
    std::memcpy(ptr, s.data(), size);
    return ptr + size;
  }